

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::weakref::weakref(weakref *this,handle obj,handle callback)

{
  PyObject *pPVar1;
  PyObject **ppPVar2;
  _object *ptr;
  long lVar3;
  error_already_set *this_00;
  handle local_28;
  weakref *local_20;
  weakref *this_local;
  handle callback_local;
  handle obj_local;
  
  local_20 = this;
  this_local = (weakref *)callback.m_ptr;
  callback_local = obj;
  ppPVar2 = handle::ptr(&callback_local);
  pPVar1 = *ppPVar2;
  ppPVar2 = handle::ptr((handle *)&this_local);
  ptr = (_object *)PyWeakref_NewRef(pPVar1,*ppPVar2);
  handle::handle<_object_*,_0>(&local_28,ptr);
  object::object(&this->super_object,local_28.m_ptr);
  if ((this->super_object).super_handle.m_ptr != (PyObject *)0x0) {
    return;
  }
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("Could not allocate weak reference!");
}

Assistant:

explicit weakref(handle obj, handle callback = {})
        : object(PyWeakref_NewRef(obj.ptr(), callback.ptr()), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate weak reference!");
        }
    }